

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::AggressiveDCEPass::KillDeadInstructions
          (AggressiveDCEPass *this,Function *func,
          list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *structured_order)

{
  BasicBlock *pBVar1;
  AggressiveDCEPass *pAVar2;
  Function *this_00;
  bool bVar3;
  uint32_t uVar4;
  uint32_t i;
  Instruction *pIVar5;
  DefUseManager *pDVar6;
  Instruction *pIVar7;
  _List_node_base *p_Var8;
  initializer_list<unsigned_int> init_list;
  bool modified;
  AggressiveDCEPass *local_c8;
  uint32_t merge_block_id;
  uint32_t local_bc;
  Function *local_b8;
  _List_node_base *local_b0;
  undefined1 local_a8 [16];
  code *local_98;
  code *local_90;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  SmallVector<unsigned_int,_2UL> local_58;
  
  modified = false;
  p_Var8 = (structured_order->
           super__List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  local_c8 = this;
  local_b8 = func;
  local_b0 = (_List_node_base *)structured_order;
  while (pAVar2 = local_c8, p_Var8 != local_b0) {
    merge_block_id = 0;
    pBVar1 = (BasicBlock *)p_Var8[1]._M_next;
    local_a8._8_8_ = 0;
    local_a8._0_8_ = ::operator_new(0x18);
    *(AggressiveDCEPass **)local_a8._0_8_ = pAVar2;
    *(bool **)(local_a8._0_8_ + 8) = &modified;
    *(uint32_t **)(local_a8._0_8_ + 0x10) = &merge_block_id;
    local_90 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp:288:24)>
               ::_M_invoke;
    local_98 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp:288:24)>
               ::_M_manager;
    BasicBlock::ForEachInst(pBVar1,(function<void_(spvtools::opt::Instruction_*)> *)local_a8,false);
    if (local_98 != (code *)0x0) {
      (*local_98)((_Any_data *)local_a8,(_Any_data *)local_a8,__destroy_functor);
    }
    pBVar1 = (BasicBlock *)p_Var8[1]._M_next;
    if (merge_block_id == 0) {
      pIVar5 = BasicBlock::terminator(pBVar1);
      bVar3 = IsLive(local_c8,pIVar5);
      if (!bVar3) {
        AddUnreachable(local_c8,(BasicBlock **)(p_Var8 + 1));
      }
      p_Var8 = p_Var8->_M_next;
    }
    else {
      AddBranch(local_c8,merge_block_id,pBVar1);
      do {
        p_Var8 = (((_List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                    *)&p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        uVar4 = BasicBlock::id((BasicBlock *)p_Var8[1]._M_next);
      } while (uVar4 != merge_block_id);
      pIVar5 = BasicBlock::terminator((BasicBlock *)p_Var8[1]._M_next);
      pAVar2 = local_c8;
      if (pIVar5->opcode_ == OpUnreachable) {
        pDVar6 = Pass::get_def_use_mgr((Pass *)local_c8);
        this_00 = local_b8;
        uVar4 = opt::Function::type_id(local_b8);
        pIVar7 = analysis::DefUseManager::GetDef(pDVar6,uVar4);
        if (pIVar7->opcode_ == OpTypeVoid) {
          pIVar5->opcode_ = OpReturn;
        }
        else {
          uVar4 = opt::Function::type_id(this_00);
          uVar4 = MemPass::Type2Undef(&pAVar2->super_MemPass,uVar4);
          pDVar6 = Pass::get_def_use_mgr((Pass *)pAVar2);
          pIVar7 = analysis::DefUseManager::GetDef(pDVar6,uVar4);
          i = Instruction::unique_id(pIVar7);
          utils::BitVector::Set(&this->live_insts_,i);
          pIVar5->opcode_ = OpReturnValue;
          init_list._M_len = 1;
          init_list._M_array = &local_bc;
          local_bc = uVar4;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
          local_a8._0_4_ = 1;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector
                    ((SmallVector<unsigned_int,_2UL> *)(local_a8 + 8),&local_58);
          local_78 = 0;
          uStack_70 = 0;
          local_68 = 0;
          std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
          _M_range_initialize<spvtools::opt::Operand_const*>
                    ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                     &local_78,local_a8,&local_78);
          Instruction::SetInOperands(pIVar5,(OperandList *)&local_78);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                    ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                     &local_78);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                    ((SmallVector<unsigned_int,_2UL> *)(local_a8 + 8));
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
          pDVar6 = Pass::get_def_use_mgr((Pass *)local_c8);
          analysis::DefUseManager::AnalyzeInstUse(pDVar6,pIVar5);
        }
        uVar4 = Instruction::unique_id(pIVar5);
        utils::BitVector::Set(&this->live_insts_,uVar4);
      }
    }
  }
  return modified;
}

Assistant:

bool AggressiveDCEPass::KillDeadInstructions(
    const Function* func, std::list<BasicBlock*>& structured_order) {
  bool modified = false;
  for (auto bi = structured_order.begin(); bi != structured_order.end();) {
    uint32_t merge_block_id = 0;
    (*bi)->ForEachInst([this, &modified, &merge_block_id](Instruction* inst) {
      if (IsLive(inst)) return;
      if (inst->opcode() == spv::Op::OpLabel) return;
      // If dead instruction is selection merge, remember merge block
      // for new branch at end of block
      if (inst->opcode() == spv::Op::OpSelectionMerge ||
          inst->opcode() == spv::Op::OpLoopMerge)
        merge_block_id = inst->GetSingleWordInOperand(0);
      to_kill_.push_back(inst);
      modified = true;
    });
    // If a structured if or loop was deleted, add a branch to its merge
    // block, and traverse to the merge block and continue processing there.
    // We know the block still exists because the label is not deleted.
    if (merge_block_id != 0) {
      AddBranch(merge_block_id, *bi);
      for (++bi; (*bi)->id() != merge_block_id; ++bi) {
      }

      auto merge_terminator = (*bi)->terminator();
      if (merge_terminator->opcode() == spv::Op::OpUnreachable) {
        // The merge was unreachable. This is undefined behaviour so just
        // return (or return an undef). Then mark the new return as live.
        auto func_ret_type_inst = get_def_use_mgr()->GetDef(func->type_id());
        if (func_ret_type_inst->opcode() == spv::Op::OpTypeVoid) {
          merge_terminator->SetOpcode(spv::Op::OpReturn);
        } else {
          // Find an undef for the return value and make sure it gets kept by
          // the pass.
          auto undef_id = Type2Undef(func->type_id());
          auto undef = get_def_use_mgr()->GetDef(undef_id);
          live_insts_.Set(undef->unique_id());
          merge_terminator->SetOpcode(spv::Op::OpReturnValue);
          merge_terminator->SetInOperands({{SPV_OPERAND_TYPE_ID, {undef_id}}});
          get_def_use_mgr()->AnalyzeInstUse(merge_terminator);
        }
        live_insts_.Set(merge_terminator->unique_id());
      }
    } else {
      Instruction* inst = (*bi)->terminator();
      if (!IsLive(inst)) {
        // If the terminator is not live, this block has no live instructions,
        // and it will be unreachable.
        AddUnreachable(*bi);
      }
      ++bi;
    }
  }
  return modified;
}